

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition
               (sysbvm_bytecodeJit_t *jit,sysbvm_jit_dwarfLineInfoEmissionState_t *state,
               sysbvm_tuple_t sourcePosition,size_t pc,uint32_t line,uint32_t column)

{
  _Bool _Var1;
  uint32_t file;
  int lineAdvance;
  int pcAdvance;
  sysbvm_sourcePosition_t *sourcePositionObject;
  uint32_t column_local;
  uint32_t line_local;
  size_t pc_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_jit_dwarfLineInfoEmissionState_t *state_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(sourcePosition);
  if (_Var1) {
    if (*(sysbvm_tuple_t *)(sourcePosition + 0x10) != state->currentFile) {
      file = sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile
                       (state,*(sysbvm_tuple_t *)(sourcePosition + 0x10));
      sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder,file);
      state->currentFile = *(sysbvm_tuple_t *)(sourcePosition + 0x10);
    }
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder,column);
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC
              (&jit->dwarfDebugInfoBuilder,line - state->previousLine,(int)pc - (int)state->pc);
    state->pc = pc;
    state->previousLine = line;
  }
  return;
}

Assistant:

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition(sysbvm_bytecodeJit_t *jit, sysbvm_jit_dwarfLineInfoEmissionState_t *state, sysbvm_tuple_t sourcePosition, size_t pc, uint32_t line, uint32_t column)
{
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition))
        return;

    sysbvm_sourcePosition_t *sourcePositionObject = (sysbvm_sourcePosition_t*)sourcePosition;

    // Set the source code.
    if(sourcePositionObject->sourceCode != state->currentFile)
    {
        sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder, sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state, sourcePositionObject->sourceCode));
        state->currentFile = sourcePositionObject->sourceCode;
    }

    // Set the column.
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder, column);

    int pcAdvance = (int)(pc - state->pc);
    int lineAdvance = line - state->previousLine;
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC(&jit->dwarfDebugInfoBuilder, lineAdvance, pcAdvance);
    state->pc = pc;
    state->previousLine = line;
}